

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O3

int __thiscall ModelWriter::estimate_memory_footprint(ModelWriter *this)

{
  pointer ppLVar1;
  pointer ppLVar2;
  pointer pBVar3;
  pointer pBVar4;
  Layer *this_00;
  int *piVar5;
  char cVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  int _h;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  Extractor ex;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> outputs;
  MemoryFootprintAllocator allocator;
  undefined1 auStack_138 [32];
  Mat local_118;
  pointer local_c8;
  pointer local_c0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_b8;
  Allocator local_98;
  undefined8 local_90;
  pthread_mutex_t local_88;
  _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  local_60;
  
  if (this->has_custom_layer == true) {
    estimate_memory_footprint();
    iVar7 = -1;
  }
  else {
    ppLVar1 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar2 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    pBVar3 = (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pBVar4 = (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_98._vptr_Allocator = (_func_int **)&PTR__MemoryFootprintAllocator_00589248;
    pthread_mutex_init(&local_88,(pthread_mutexattr_t *)0x0);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90 = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    ncnn::Net::create_extractor((Net *)auStack_138);
    local_c8 = pBVar3;
    local_c0 = pBVar4;
    ncnn::Extractor::set_light_mode((Extractor *)auStack_138,true);
    ncnn::Extractor::set_blob_allocator((Extractor *)auStack_138,&local_98);
    ncnn::Extractor::set_workspace_allocator((Extractor *)auStack_138,&local_98);
    if (ppLVar2 != ppLVar1) {
      lVar10 = (long)ppLVar2 - (long)ppLVar1 >> 3;
      lVar11 = 0;
      do {
        this_00 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[lVar11];
        iVar7 = std::__cxx11::string::compare((char *)&this_00->type);
        if ((iVar7 != 0) &&
           (iVar7 = std::__cxx11::string::compare((char *)&this_00->type), iVar7 == 0)) {
          iVar7 = *(int *)&this_00[1]._vptr_Layer;
          _h = *(int *)((long)&this_00[1]._vptr_Layer + 4);
          auStack_138[0x1c] = this_00[1].support_bf16_storage;
          auStack_138[0x1d] = this_00[1].support_fp16_storage;
          auStack_138[0x1e] = this_00[1].support_int8_storage;
          auStack_138[0x1f] = this_00[1].support_image_storage;
          bVar13 = iVar7 != 0;
          bVar9 = (_h == 0 && auStack_138._28_4_ == 0) && bVar13;
          bVar14 = _h == 0;
          bVar15 = auStack_138._28_4_ == 0;
          cVar6 = bVar9;
          if (bVar15) {
            cVar6 = '\x02';
          }
          if (bVar14 || !bVar13) {
            cVar6 = bVar9;
          }
          if (!bVar15 && (!bVar14 && bVar13)) {
            cVar6 = '\x03';
          }
          if (cVar6 == '\0') {
            estimate_memory_footprint((ModelWriter *)this_00);
            iVar7 = -1;
            goto LAB_0015b2fc;
          }
          local_118.cstep = 0;
          local_118.data = (void *)0x0;
          local_118.refcount._0_1_ = false;
          local_118.refcount._1_1_ = false;
          local_118.refcount._2_1_ = false;
          local_118.refcount._3_1_ = false;
          local_118.refcount._4_1_ = false;
          local_118.refcount._5_1_ = false;
          local_118.refcount._6_1_ = false;
          local_118.refcount._7_1_ = false;
          local_118.elemsize._0_1_ = false;
          local_118.elemsize._1_1_ = false;
          local_118.elemsize._2_1_ = false;
          local_118.elemsize._3_1_ = false;
          local_118._20_8_ = 0;
          local_118.h = 0;
          local_118.d = 0;
          local_118.c = 0;
          local_118.allocator = (Allocator *)0x0;
          local_118.dims = 0;
          local_118.w = 0;
          if (cVar6 == '\x03') {
LAB_0015b45b:
            ncnn::Mat::create(&local_118,iVar7,_h,auStack_138._28_4_,4,&local_98);
          }
          else if (cVar6 == '\x02') {
            auStack_138._20_4_ = _h;
            auStack_138._24_4_ = iVar7;
            ncnn::Mat::create(&local_118,iVar7,_h,4,&local_98);
            iVar7 = auStack_138._24_4_;
            _h = auStack_138._20_4_;
            if (!bVar15 && (!bVar14 && bVar13)) goto LAB_0015b45b;
          }
          else {
            ncnn::Mat::create(&local_118,iVar7,4,&local_98);
          }
          ncnn::Extractor::input
                    ((Extractor *)auStack_138,
                     **(int **)&(this_00->tops).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl,&local_118);
          fprintf(_stderr,"input = %s\n",
                  (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl
                  .super__Vector_impl_data._M_start
                  [**(int **)&(this_00->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl]
                  .name._M_dataplus._M_p);
          piVar5 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_118.allocator == (Allocator *)0x0) {
                if (local_118.data != (void *)0x0) {
                  free(local_118.data);
                }
              }
              else {
                (*(local_118.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar10 + (ulong)(lVar10 == 0) != lVar11);
    }
    local_b8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_c0 != local_c8) {
      lVar11 = ((long)local_c0 - (long)local_c8 >> 4) * 0x6db6db6db6db6db7;
      lVar10 = 0x24;
      lVar12 = 0;
      do {
        pBVar3 = (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = (long)*(int *)((long)pBVar3 + lVar10 + -4);
        if (((lVar8 != -1) && (*(int *)((long)&(pBVar3->name)._M_dataplus._M_p + lVar10) == -1)) &&
           (iVar7 = std::__cxx11::string::compare
                              ((char *)&(this->layers->
                                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start[lVar8]->type),
           iVar7 != 0)) {
          local_118.cstep = 0;
          local_118.data = (void *)0x0;
          local_118.refcount._0_1_ = false;
          local_118.refcount._1_1_ = false;
          local_118.refcount._2_1_ = false;
          local_118.refcount._3_1_ = false;
          local_118.refcount._4_1_ = false;
          local_118.refcount._5_1_ = false;
          local_118.refcount._6_1_ = false;
          local_118.refcount._7_1_ = false;
          local_118.elemsize._0_1_ = false;
          local_118.elemsize._1_1_ = false;
          local_118.elemsize._2_1_ = false;
          local_118.elemsize._3_1_ = false;
          local_118._20_8_ = 0;
          local_118.h = 0;
          local_118.d = 0;
          local_118.c = 0;
          local_118.allocator = (Allocator *)0x0;
          local_118.dims = 0;
          local_118.w = 0;
          ncnn::Extractor::extract((Extractor *)auStack_138,(int)lVar12,&local_118,0);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back(&local_b8,&local_118);
          fprintf(_stderr,"extract = %s\n",*(undefined8 *)((long)pBVar3 + lVar10 + -0x24));
          piVar5 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_118.allocator == (Allocator *)0x0) {
                if (local_118.data != (void *)0x0) {
                  free(local_118.data);
                }
              }
              else {
                (*(local_118.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        lVar12 = lVar12 + 1;
        lVar10 = lVar10 + 0x70;
      } while (lVar11 + (ulong)(lVar11 == 0) != lVar12);
    }
    estimate_memory_footprint();
    iVar7 = 0;
LAB_0015b2fc:
    ncnn::Extractor::~Extractor((Extractor *)auStack_138);
    local_98._vptr_Allocator = (_func_int **)&PTR__MemoryFootprintAllocator_00589248;
    std::
    _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
    ::~_Rb_tree(&local_60);
    pthread_mutex_destroy(&local_88);
    ncnn::Allocator::~Allocator(&local_98);
  }
  return iVar7;
}

Assistant:

int ModelWriter::estimate_memory_footprint()
{
    if (has_custom_layer)
    {
        fprintf(stderr, "model has custom layer, estimate_memory_footprint skipped\n");
        return -1;
    }

    const size_t layer_count = layers.size();
    const size_t blob_count = blobs.size();

    MemoryFootprintAllocator allocator;

    ncnn::Extractor ex = create_extractor();
    ex.set_light_mode(true);

    ex.set_blob_allocator(&allocator);
    ex.set_workspace_allocator(&allocator);

    // prepare Input blobs
    for (size_t i = 0; i < layer_count; i++)
    {
        const ncnn::Layer* layer = layers[i];
        if (layer->type == "ncnnfused")
            continue;

        if (layer->type != "Input")
            continue;

        ncnn::Input* input = (ncnn::Input*)layer;

        int w = input->w;
        int h = input->h;
        int c = input->c;

        int dims = 0;
        if (w == 0 && h == 0 && c == 0) dims = 0;
        if (w != 0 && h == 0 && c == 0) dims = 1;
        if (w != 0 && h != 0 && c == 0) dims = 2;
        if (w != 0 && h != 0 && c != 0) dims = 3;

        if (dims == 0)
        {
            fprintf(stderr, "Input layer %s without shape info, estimate_memory_footprint skipped\n", layer->name.c_str());
            return -1;
        }

        ncnn::Mat m;
        if (dims == 1) m.create(w, 4u, &allocator);
        if (dims == 2) m.create(w, h, 4u, &allocator);
        if (dims == 3) m.create(w, h, c, 4u, &allocator);

        ex.input(layer->tops[0], m);

        fprintf(stderr, "input = %s\n", blobs[layer->tops[0]].name.c_str());
    }

    // find output blobs and do inference
    std::vector<ncnn::Mat> outputs;
    for (size_t i = 0; i < blob_count; i++)
    {
        const ncnn::Blob& blob = blobs[i];

        if (blob.producer == -1 || blob.consumer != -1)
            continue;

        if (layers[blob.producer]->type == "ncnnfused")
            continue;

        // treat blob without any consumers as output
        ncnn::Mat m;
        ex.extract(int(i), m);
        outputs.push_back(m);

        fprintf(stderr, "extract = %s\n", blob.name.c_str());
    }

    fprintf(stderr, "estimated memory footprint = %.2f KB = %.2f MB\n", allocator.memory_footprint / 1024.f, allocator.memory_footprint / 1024.f / 1024.f);

    return 0;
}